

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void stb_swap(void *p,void *q,size_t sz)

{
  undefined4 uVar1;
  undefined8 uVar2;
  char buffer [256];
  undefined1 auStack_128 [264];
  
  if (p != q) {
    if (sz == 4) {
      uVar1 = *p;
      *(undefined4 *)p = *q;
      *(undefined4 *)q = uVar1;
    }
    else if (sz == 8) {
      uVar2 = *p;
      *(undefined8 *)p = *q;
      *(undefined8 *)q = uVar2;
    }
    else {
      if (0x100 < sz) {
        do {
          stb_swap(p,q,0x100);
          p = (void *)((long)p + 0x100);
          q = (void *)((long)q + 0x100);
          sz = sz - 0x100;
        } while (0x100 < sz);
      }
      SDL_memcpy(auStack_128,p,sz);
      SDL_memcpy(p,q,sz);
      SDL_memcpy(q,auStack_128,sz);
    }
  }
  return;
}

Assistant:

void stb_swap(void *p, void *q, size_t sz)
{
   char buffer[256];
   if (p == q) return;
   if (sz == 4) {
      stb__4 temp    = * ( stb__4 *) p;
      * (stb__4 *) p = * ( stb__4 *) q;
      * (stb__4 *) q = temp;
      return;
   } else if (sz == 8) {
      stb__8 temp    = * ( stb__8 *) p;
      * (stb__8 *) p = * ( stb__8 *) q;
      * (stb__8 *) q = temp;
      return;
   }

   while (sz > sizeof(buffer)) {
      stb_swap(p, q, sizeof(buffer));
      p = (char *) p + sizeof(buffer);
      q = (char *) q + sizeof(buffer);
      sz -= sizeof(buffer);
   }

   memcpy(buffer, p     , sz);
   memcpy(p     , q     , sz);
   memcpy(q     , buffer, sz);
}